

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O1

void __thiscall chrono::utils::ChChaseCamera::Turn(ChChaseCamera *this,int val)

{
  double dVar1;
  
  if ((val != 0) && (1 < this->m_state - Follow)) {
    if (this->m_state == Free) {
      if (val < 0) {
        dVar1 = this->m_angle + 0.005235987755982988;
      }
      else {
        dVar1 = this->m_angle + -0.005235987755982988;
      }
    }
    else if ((-1 < val) || (this->m_angle <= -3.141592653589793)) {
      if (val < 1) {
        return;
      }
      if (3.141592653589793 <= this->m_angle) {
        return;
      }
      dVar1 = this->m_angle + 0.031415926535897934;
    }
    else {
      dVar1 = this->m_angle + -0.031415926535897934;
    }
    this->m_angle = dVar1;
  }
  return;
}

Assistant:

void ChChaseCamera::Turn(int val) {
    if (val == 0 || m_state == Follow || m_state == Track)
        return;

    if (m_state == Free) {
        if (val < 0)
            m_angle += CH_C_PI / 600;
        else
            m_angle -= CH_C_PI / 600;

        return;
    }

    if (val < 0 && m_angle > -CH_C_PI)
        m_angle -= CH_C_PI / 100;
    else if (val > 0 && m_angle < CH_C_PI)
        m_angle += CH_C_PI / 100;
}